

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::CFactory::getDisplayName
          (CFactory *this,UnicodeString *id,Locale *locale,UnicodeString *result)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  undefined4 extraout_var_00;
  undefined1 local_120 [8];
  Locale loc;
  Hashtable *ids;
  UnicodeString *pUStack_30;
  UErrorCode status;
  UnicodeString *result_local;
  Locale *locale_local;
  UnicodeString *id_local;
  CFactory *this_local;
  
  pUStack_30 = result;
  result_local = (UnicodeString *)locale;
  locale_local = (Locale *)id;
  id_local = (UnicodeString *)this;
  if (((this->super_LocaleKeyFactory)._coverage & 1U) == 0) {
    ids._4_4_ = 0;
    iVar1 = (*(this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject[8])
                      (this,(long)&ids + 4);
    loc._216_8_ = CONCAT44(extraout_var,iVar1);
    if (((Hashtable *)loc._216_8_ != (Hashtable *)0x0) &&
       (pvVar2 = Hashtable::get((Hashtable *)loc._216_8_,(UnicodeString *)locale_local),
       pvVar2 != (void *)0x0)) {
      Locale::Locale((Locale *)local_120);
      LocaleUtility::initLocaleFromName((UnicodeString *)locale_local,(Locale *)local_120);
      iVar1 = (*(this->_delegate->super_UObject)._vptr_UObject[5])
                        (this->_delegate,local_120,result_local,pUStack_30);
      this_local = (CFactory *)CONCAT44(extraout_var_00,iVar1);
      Locale::~Locale((Locale *)local_120);
      return (UnicodeString *)this_local;
    }
  }
  UnicodeString::setToBogus(pUStack_30);
  return pUStack_30;
}

Assistant:

UnicodeString&
CFactory::getDisplayName(const UnicodeString& id, const Locale& locale, UnicodeString& result) const 
{
    if ((_coverage & 0x1) == 0) {
        UErrorCode status = U_ZERO_ERROR;
        const Hashtable* ids = getSupportedIDs(status);
        if (ids && (ids->get(id) != NULL)) {
            Locale loc;
            LocaleUtility::initLocaleFromName(id, loc);
            return _delegate->getDisplayName(loc, locale, result);
        }
    }
    result.setToBogus();
    return result;
}